

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_build_err.cxx
# Opt level: O0

void __thiscall xray_re::xr_build_err::save(xr_build_err *this,xr_writer *w)

{
  int iVar1;
  undefined4 extraout_var;
  uint8_t *puVar3;
  size_t size;
  xr_writer *w_local;
  xr_build_err *this_local;
  ulong uVar2;
  
  xr_writer::open_chunk(w,0);
  xr_writer::w_u32(w,0);
  xr_writer::close_chunk(w);
  xr_writer::open_chunk(w,1);
  xr_writer::w_u32(w,0);
  xr_writer::close_chunk(w);
  iVar1 = (*(this->m_invalid->super_xr_writer)._vptr_xr_writer[4])();
  uVar2 = CONCAT44(extraout_var,iVar1);
  xr_writer::open_chunk(w,2);
  xr_writer::w_size_u32(w,uVar2 / 0x24);
  if (uVar2 != 0) {
    puVar3 = xr_memory_writer::data(this->m_invalid);
    (*w->_vptr_xr_writer[2])(w,puVar3,uVar2);
  }
  xr_writer::close_chunk(w);
  return;
}

Assistant:

void xr_build_err::save(xr_writer& w) const
{
	w.open_chunk(ERR_CHUNK_TJUNCTION);
	w.w_u32(0);
	w.close_chunk();

	w.open_chunk(ERR_CHUNK_MULTIEDGE);
	w.w_u32(0);
	w.close_chunk();

	size_t size = m_invalid->tell();
	w.open_chunk(ERR_CHUNK_INVALID);
	w.w_size_u32(size/(3*sizeof(fvector3)));
	if (size)
		w.w_raw(m_invalid->data(), size);
	w.close_chunk();
}